

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

int socket_bind_listen(int port)

{
  int iVar1;
  undefined1 local_28 [8];
  sockaddr_in server_addr;
  int optval;
  int listen_fd;
  int port_local;
  
  if ((port < 0) || (0xffff < port)) {
    listen_fd = -1;
  }
  else {
    server_addr.sin_zero[4] = '\0';
    server_addr.sin_zero[5] = '\0';
    server_addr.sin_zero[6] = '\0';
    server_addr.sin_zero[7] = '\0';
    server_addr.sin_zero._4_4_ = socket(2,1,0);
    if (server_addr.sin_zero._4_4_ == -1) {
      listen_fd = -1;
    }
    else {
      server_addr.sin_zero[0] = '\x01';
      server_addr.sin_zero[1] = '\0';
      server_addr.sin_zero[2] = '\0';
      server_addr.sin_zero[3] = '\0';
      iVar1 = setsockopt(server_addr.sin_zero._4_4_,1,2,server_addr.sin_zero,4);
      if (iVar1 == -1) {
        close(server_addr.sin_zero._4_4_);
        listen_fd = -1;
      }
      else {
        bzero(local_28,0x10);
        local_28._0_2_ = 2;
        local_28._4_4_ = htonl(0);
        local_28._2_2_ = htons((uint16_t)port);
        iVar1 = bind(server_addr.sin_zero._4_4_,(sockaddr *)local_28,0x10);
        if (iVar1 == -1) {
          close(server_addr.sin_zero._4_4_);
          listen_fd = -1;
        }
        else {
          iVar1 = listen(server_addr.sin_zero._4_4_,0x800);
          if (iVar1 == -1) {
            close(server_addr.sin_zero._4_4_);
            listen_fd = -1;
          }
          else if (server_addr.sin_zero._4_4_ == -1) {
            close(-1);
            listen_fd = -1;
          }
          else {
            listen_fd._0_1_ = server_addr.sin_zero[4];
            listen_fd._1_1_ = server_addr.sin_zero[5];
            listen_fd._2_1_ = server_addr.sin_zero[6];
            listen_fd._3_1_ = server_addr.sin_zero[7];
          }
        }
      }
    }
  }
  return listen_fd;
}

Assistant:

int socket_bind_listen(int port) {
  // 检查port值，取正确区间范围
  if (port < 0 || port > 65535) return -1;

  // 创建socket(IPv4 + TCP)，返回监听描述符
  int listen_fd = 0;
  if ((listen_fd = socket(AF_INET, SOCK_STREAM, 0)) == -1) return -1;

  // 消除bind时"Address already in use"错误
  int optval = 1;
  if (setsockopt(listen_fd, SOL_SOCKET, SO_REUSEADDR, &optval,
                 sizeof(optval)) == -1) {
    close(listen_fd);
    return -1;
  }

  // 设置服务器IP和Port，和监听描述副绑定
  struct sockaddr_in server_addr;
  bzero((char *)&server_addr, sizeof(server_addr));
  server_addr.sin_family = AF_INET;
  server_addr.sin_addr.s_addr = htonl(INADDR_ANY);
  server_addr.sin_port = htons((unsigned short)port);
  if (bind(listen_fd, (struct sockaddr *)&server_addr, sizeof(server_addr)) ==
      -1) {
    close(listen_fd);
    return -1;
  }

  // 开始监听，最大等待队列长为LISTENQ
  if (listen(listen_fd, 2048) == -1) {
    close(listen_fd);
    return -1;
  }

  // 无效监听描述符
  if (listen_fd == -1) {
    close(listen_fd);
    return -1;
  }
  return listen_fd;
}